

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall cmComputeTargetDepends::CollectTargets(cmComputeTargetDepends *this)

{
  bool bVar1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_00;
  size_type sVar2;
  const_reference ppcVar3;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__x;
  reference ppcVar4;
  mapped_type_conflict *pmVar5;
  cmGeneratorTarget *pcStack_50;
  int index;
  cmGeneratorTarget *gt;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_40;
  const_iterator ti;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  uint i;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgens;
  cmComputeTargetDepends *this_local;
  
  this_00 = cmGlobalGenerator::GetLocalGenerators(this->GlobalGenerator);
  targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    sVar2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size(this_00);
    if (sVar2 <= targets.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) break;
    ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (this_00,(ulong)targets.
                                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    __x = cmLocalGenerator::GetGeneratorTargets(*ppcVar3);
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti,__x);
    local_40._M_current =
         (cmGeneratorTarget **)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                   ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
    while( true ) {
      gt = (cmGeneratorTarget *)
           std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                     ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
      bVar1 = __gnu_cxx::operator!=
                        (&local_40,
                         (__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                          *)&gt);
      if (!bVar1) break;
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_40);
      pcStack_50 = *ppcVar4;
      sVar2 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
              size(&this->Targets);
      pmVar5 = std::
               map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
               ::operator[](&this->TargetIndex,&stack0xffffffffffffffb0);
      *pmVar5 = (mapped_type_conflict)sVar2;
      std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::push_back
                (&this->Targets,&stack0xffffffffffffffb0);
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&local_40);
    }
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
    targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectTargets()
{
  // Collect all targets from all generators.
  std::vector<cmLocalGenerator*> const& lgens =
    this->GlobalGenerator->GetLocalGenerators();
  for (unsigned int i = 0; i < lgens.size(); ++i) {
    const std::vector<cmGeneratorTarget*> targets =
      lgens[i]->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::const_iterator ti = targets.begin();
         ti != targets.end(); ++ti) {
      cmGeneratorTarget* gt = *ti;
      int index = static_cast<int>(this->Targets.size());
      this->TargetIndex[gt] = index;
      this->Targets.push_back(gt);
    }
  }
}